

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void linearize_function(LinearizerState *linearizer)

{
  Proc *proc;
  AstNode *pAVar1;
  Proc *proc_00;
  AstNode *pAVar2;
  _Bool _Var3;
  BasicBlock *bb_to_start;
  BasicBlock *pBVar4;
  void *pvVar5;
  Instruction *insn;
  Pseudo *pseudo;
  uint line_number;
  Scope *scope;
  PtrListIterator local_40;
  
  proc = linearizer->current_proc;
  if (proc == (Proc *)0x0) {
    __assert_fail("proc != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe4,"void linearize_function(LinearizerState *)");
  }
  pAVar1 = proc->function_expr;
  if (pAVar1->type != EXPR_FUNCTION) {
    __assert_fail("func_expr->type == EXPR_FUNCTION",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe6,"void linearize_function(LinearizerState *)");
  }
  bb_to_start = create_block(proc);
  if (bb_to_start->index != 0) {
    __assert_fail("entry->index == ENTRY_BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xb9b,"void initialize_graph(Proc *)");
  }
  pBVar4 = create_block(proc);
  if (pBVar4->index == 1) {
    start_block(proc,bb_to_start,proc->function_expr->line_number);
    if (proc->node_count < 2) {
      __assert_fail("proc->node_count >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0xbe8,"void linearize_function(LinearizerState *)");
    }
    if (*proc->nodes != (BasicBlock *)0x0) {
      if (proc->nodes[1] == (BasicBlock *)0x0) {
        __assert_fail("proc->nodes[EXIT_BLOCK] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                      ,0xbea,"void linearize_function(LinearizerState *)");
      }
      start_scope((LinearizerState *)proc,(Proc *)(pAVar1->field_2).for_stmt.for_statement_list,
                  scope);
      proc_00 = linearizer->current_proc;
      pAVar2 = proc_00->function_expr;
      raviX_ptrlist_forward_iterator(&local_40,(PtrList *)(pAVar2->field_2).function_expr.args);
      while( true ) {
        pvVar5 = raviX_ptrlist_iter_next(&local_40);
        if (pvVar5 == (void *)0x0) {
          linearize_statement_list(proc,(pAVar1->field_2).function_expr.function_statement_list);
          end_scope((LinearizerState *)proc,(Proc *)(ulong)pAVar1->line_number,line_number);
          _Var3 = is_block_terminated(proc->current_bb);
          if (!_Var3) {
            insn = allocate_instruction(proc,op_ret,pAVar1->line_number);
            pseudo = allocate_block_pseudo(proc,proc->nodes[1]);
            add_instruction_target(proc,insn,pseudo);
            add_instruction(proc,insn);
          }
          return;
        }
        if (*(Pseudo **)((long)pvVar5 + 0x38) == (Pseudo *)0x0) break;
        instruct_totype(proc_00,*(Pseudo **)((long)pvVar5 + 0x38),(VariableType *)((long)pvVar5 + 8)
                        ,pAVar2->line_number);
      }
      __assert_fail("sym->variable.pseudo",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0x2da,"void linearize_function_args(LinearizerState *)");
    }
    __assert_fail("proc->nodes[ENTRY_BLOCK] != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0xbe9,"void linearize_function(LinearizerState *)");
  }
  __assert_fail("exit->index == EXIT_BLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0xb9d,"void initialize_graph(Proc *)");
}

Assistant:

static void linearize_function(LinearizerState *linearizer)
{
	Proc *proc = linearizer->current_proc;
	assert(proc != NULL);
	AstNode *func_expr = proc->function_expr;
	assert(func_expr->type == EXPR_FUNCTION);
	initialize_graph(proc);
	assert(proc->node_count >= 2);
	assert(proc->nodes[ENTRY_BLOCK] != NULL);
	assert(proc->nodes[EXIT_BLOCK] != NULL);
	start_scope(linearizer, proc, func_expr->function_expr.main_block);
	linearize_function_args(linearizer);
	linearize_statement_list(proc, func_expr->function_expr.function_statement_list);
	end_scope(linearizer, proc, func_expr->line_number);
	if (!is_block_terminated(proc->current_bb)) {
		Instruction *insn = allocate_instruction(proc, op_ret, func_expr->line_number);
		add_instruction_target(proc, insn, allocate_block_pseudo(proc, proc->nodes[EXIT_BLOCK]));
		add_instruction(proc, insn);
	}
}